

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O3

bam_hdr_t * bam_hdr_dup(bam_hdr_t *h0)

{
  uint uVar1;
  ulong uVar2;
  uint32_t *puVar3;
  char **ppcVar4;
  bam_hdr_t *pbVar5;
  char *pcVar6;
  uint32_t *puVar7;
  char **ppcVar8;
  ulong uVar9;
  
  if ((h0 == (bam_hdr_t *)0x0) || (pbVar5 = (bam_hdr_t *)calloc(1,0x38), pbVar5 == (bam_hdr_t *)0x0)
     ) {
    pbVar5 = (bam_hdr_t *)0x0;
  }
  else {
    uVar2._0_4_ = h0->n_targets;
    uVar2._4_4_ = h0->ignore_sam_err;
    pbVar5->n_targets = (undefined4)uVar2;
    pbVar5->ignore_sam_err = uVar2._4_4_;
    uVar1 = h0->l_text;
    pbVar5->l_text = uVar1;
    pcVar6 = (char *)calloc((ulong)(uVar1 + 1),1);
    pbVar5->text = pcVar6;
    memcpy(pcVar6,h0->text,(ulong)uVar1);
    puVar7 = (uint32_t *)calloc((long)(int)(undefined4)uVar2,4);
    pbVar5->target_len = puVar7;
    ppcVar8 = (char **)calloc((long)(int)(undefined4)uVar2,8);
    pbVar5->target_name = ppcVar8;
    if (0 < (int)(undefined4)uVar2) {
      puVar3 = h0->target_len;
      ppcVar4 = h0->target_name;
      uVar9 = 0;
      do {
        puVar7[uVar9] = puVar3[uVar9];
        pcVar6 = strdup(ppcVar4[uVar9]);
        ppcVar8[uVar9] = pcVar6;
        uVar9 = uVar9 + 1;
      } while ((uVar2 & 0xffffffff) != uVar9);
    }
  }
  return pbVar5;
}

Assistant:

bam_hdr_t *bam_hdr_dup(const bam_hdr_t *h0)
{
    if (h0 == NULL) return NULL;
    bam_hdr_t *h;
    if ((h = bam_hdr_init()) == NULL) return NULL;
    // copy the simple data
    h->n_targets = h0->n_targets;
    h->ignore_sam_err = h0->ignore_sam_err;
    h->l_text = h0->l_text;
    // Then the pointery stuff
    h->cigar_tab = NULL;
    h->sdict = NULL;
    h->text = (char*)calloc(h->l_text + 1, 1);
    memcpy(h->text, h0->text, h->l_text);
    h->target_len = (uint32_t*)calloc(h->n_targets, sizeof(uint32_t));
    h->target_name = (char**)calloc(h->n_targets, sizeof(char*));
    int i;
    for (i = 0; i < h->n_targets; ++i) {
        h->target_len[i] = h0->target_len[i];
        h->target_name[i] = strdup(h0->target_name[i]);
    }
    return h;
}